

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_segment_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_84ef6b::AqSegmentTest::~AqSegmentTest(AqSegmentTest *this)

{
  code *pcVar1;
  AqSegmentTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~AqSegmentTest() override = default;